

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O3

int create_handshake_flow(quicly_conn_t *conn,size_t epoch)

{
  int err;
  quicly_stream_t *stream;
  
  stream = open_stream(conn,~epoch,0x10000,0x10000);
  if (stream == (quicly_stream_t *)0x0) {
    err = 0x201;
  }
  else {
    err = quicly_streambuf_create(stream,0x48);
    if (err == 0) {
      stream->callbacks = &crypto_stream_callbacks;
      err = 0;
    }
    else {
      destroy_stream(stream,err);
    }
  }
  return err;
}

Assistant:

static int create_handshake_flow(quicly_conn_t *conn, size_t epoch)
{
    quicly_stream_t *stream;
    int ret;

    if ((stream = open_stream(conn, -(quicly_stream_id_t)(1 + epoch), 65536, 65536)) == NULL)
        return PTLS_ERROR_NO_MEMORY;
    if ((ret = quicly_streambuf_create(stream, sizeof(quicly_streambuf_t))) != 0) {
        destroy_stream(stream, ret);
        return ret;
    }
    stream->callbacks = &crypto_stream_callbacks;

    return 0;
}